

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall
Node::AddList(Node *this,string *name,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *attribute_list)

{
  bool bVar1;
  reference pbVar2;
  element_type *this_00;
  shared_ptr<Node> local_100;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator local_59;
  string local_58 [8];
  string list_string;
  undefined1 local_30 [8];
  shared_ptr<Node> list_node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *attribute_list_local;
  string *name_local;
  Node *this_local;
  
  list_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)attribute_list;
  std::make_shared<Node,std::__cxx11::string&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (bool *)name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(attribute_list);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(attribute_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_88);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_a8,(string *)pbVar2);
    std::__cxx11::string::append(local_58);
    std::__cxx11::string::append((char *)local_58);
    std::__cxx11::string::~string(local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_00 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"List",&local_c9);
  std::__cxx11::string::string(local_f0,local_58);
  AddAttribute(this_00,(string *)local_c8,(string *)local_f0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::shared_ptr<Node>::shared_ptr(&local_100,(shared_ptr<Node> *)local_30);
  AddChild(this,&local_100);
  std::shared_ptr<Node>::~shared_ptr(&local_100);
  std::__cxx11::string::~string(local_58);
  std::shared_ptr<Node>::~shared_ptr((shared_ptr<Node> *)local_30);
  return;
}

Assistant:

void Node::AddList(std::string name, std::vector<std::string> attribute_list) {
    std::shared_ptr<Node> list_node = std::make_shared<Node>(name, true);
    std::string list_string = "";
    for(auto item: attribute_list) {
        list_string.append(item);
        list_string.append(";");
    }
    list_node->AddAttribute("List", list_string);
    this->AddChild(list_node);
}